

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomenv.cpp
# Opt level: O2

void anon_unknown.dwarf_11a70e9::AddSockaddr(CSHA512 *hasher,sockaddr *addr)

{
  size_t len;
  size_t sVar1;
  long in_FS_OFFSET;
  
  if (addr == (sockaddr *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      return;
    }
  }
  else {
    sVar1 = 2;
    if (addr->sa_family == 10) {
      sVar1 = 0x1c;
    }
    len = 0x10;
    if (addr->sa_family != 2) {
      len = sVar1;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      CSHA512::Write(hasher,(uchar *)addr,len);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void AddSockaddr(CSHA512& hasher, const struct sockaddr *addr)
{
    if (addr == nullptr) return;
    switch (addr->sa_family) {
    case AF_INET:
        hasher.Write((const unsigned char*)addr, sizeof(sockaddr_in));
        break;
    case AF_INET6:
        hasher.Write((const unsigned char*)addr, sizeof(sockaddr_in6));
        break;
    default:
        hasher.Write((const unsigned char*)&addr->sa_family, sizeof(addr->sa_family));
    }
}